

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::PrintLinkPolicyDiagnosis(cmComputeLinkInformation *this,ostream *os)

{
  pointer pbVar1;
  ostream *poVar2;
  string *psVar3;
  pointer pbVar4;
  string *i;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar5;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  emitted;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_80;
  string local_50;
  
  poVar2 = std::operator<<(os,"Policy CMP0003 should be set before this line.  ");
  poVar2 = std::operator<<(poVar2,"Add code such as\n");
  poVar2 = std::operator<<(poVar2,"  if(COMMAND cmake_policy)\n");
  poVar2 = std::operator<<(poVar2,"    cmake_policy(SET CMP0003 NEW)\n");
  poVar2 = std::operator<<(poVar2,"  endif(COMMAND cmake_policy)\n");
  poVar2 = std::operator<<(poVar2,"as early as possible but after the most recent call to ");
  std::operator<<(poVar2,"cmake_minimum_required or cmake_policy(VERSION).  ");
  poVar2 = std::operator<<(os,"This warning appears because target \"");
  psVar3 = cmGeneratorTarget::GetName_abi_cxx11_(this->Target);
  poVar2 = std::operator<<(poVar2,(string *)psVar3);
  poVar2 = std::operator<<(poVar2,"\" ");
  std::operator<<(poVar2,"links to some libraries for which the linker must search:\n");
  local_80._M_impl._0_8_ = &local_80._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_80._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)
       ((ulong)local_80._M_impl.super__Rb_tree_header._M_header._M_parent & 0xffffffffffffff00);
  pbVar1 = (this->OldUserFlagItems).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar4 = (this->OldUserFlagItems).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    if ((local_80._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) &&
       ((local_80._M_impl.super__Rb_tree_header._M_header._0_8_ + pbVar4->_M_string_length) - 0x4b <
        0xffffffffffffffb3)) {
      poVar2 = std::operator<<(os,(string *)&local_80);
      std::operator<<(poVar2,"\n");
      local_80._M_impl.super__Rb_tree_header._M_header._0_8_ = 0;
      *(undefined1 *)local_80._M_impl._0_8_ = 0;
    }
    std::__cxx11::string::append((char *)&local_80);
    std::__cxx11::string::append((string *)&local_80);
  }
  if (local_80._M_impl.super__Rb_tree_header._M_header._0_8_ != 0) {
    poVar2 = std::operator<<(os,(string *)&local_80);
    std::operator<<(poVar2,"\n");
  }
  std::__cxx11::string::~string((string *)&local_80);
  std::operator<<(os,"and other libraries with known full path:\n");
  local_80._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_80._M_impl.super__Rb_tree_header._M_header;
  local_80._M_impl.super__Rb_tree_header._M_header._0_8_ =
       local_80._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
  local_80._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_80._M_impl.super__Rb_tree_header._M_node_count = 0;
  pbVar1 = (this->OldLinkDirItems).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_80._M_impl.super__Rb_tree_header._M_header._M_right =
       local_80._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pbVar4 = (this->OldLinkDirItems).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar4 != pbVar1; pbVar4 = pbVar4 + 1) {
    cmsys::SystemTools::GetFilenamePath(&local_50,pbVar4);
    pVar5 = std::
            _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
            ::_M_insert_unique<std::__cxx11::string>
                      ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                        *)&local_80,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (((undefined1  [16])pVar5 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
      poVar2 = std::operator<<(os,"  ");
      poVar2 = std::operator<<(poVar2,(string *)pbVar4);
      std::operator<<(poVar2,"\n");
    }
  }
  poVar2 = std::operator<<(os,"CMake is adding directories in the second list to the linker ");
  poVar2 = std::operator<<(poVar2,"search path in case they are needed to find libraries from the ")
  ;
  poVar2 = std::operator<<(poVar2,"first list (for backwards compatibility with CMake 2.4).  ");
  poVar2 = std::operator<<(poVar2,"Set policy CMP0003 to OLD or NEW to enable or disable this ");
  poVar2 = std::operator<<(poVar2,"behavior explicitly.  ");
  std::operator<<(poVar2,"Run \"cmake --help-policy CMP0003\" for more information.");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_80);
  return;
}

Assistant:

void cmComputeLinkInformation::PrintLinkPolicyDiagnosis(std::ostream& os)
{
  // Tell the user what to do.
  /* clang-format off */
  os << "Policy CMP0003 should be set before this line.  "
     << "Add code such as\n"
     << "  if(COMMAND cmake_policy)\n"
     << "    cmake_policy(SET CMP0003 NEW)\n"
     << "  endif(COMMAND cmake_policy)\n"
     << "as early as possible but after the most recent call to "
     << "cmake_minimum_required or cmake_policy(VERSION).  ";
  /* clang-format on */

  // List the items that might need the old-style paths.
  os << "This warning appears because target \"" << this->Target->GetName()
     << "\" "
     << "links to some libraries for which the linker must search:\n";
  {
    // Format the list of unknown items to be as short as possible while
    // still fitting in the allowed width (a true solution would be the
    // bin packing problem if we were allowed to change the order).
    std::string::size_type max_size = 76;
    std::string line;
    const char* sep = "  ";
    for (std::string const& i : this->OldUserFlagItems) {
      // If the addition of another item will exceed the limit then
      // output the current line and reset it.  Note that the separator
      // is either " " or ", " which is always 2 characters.
      if (!line.empty() && (line.size() + i.size() + 2) > max_size) {
        os << line << "\n";
        sep = "  ";
        line.clear();
      }
      line += sep;
      line += i;
      // Convert to the other separator.
      sep = ", ";
    }
    if (!line.empty()) {
      os << line << "\n";
    }
  }

  // List the paths old behavior is adding.
  os << "and other libraries with known full path:\n";
  std::set<std::string> emitted;
  for (std::string const& i : this->OldLinkDirItems) {
    if (emitted.insert(cmSystemTools::GetFilenamePath(i)).second) {
      os << "  " << i << "\n";
    }
  }

  // Explain.
  os << "CMake is adding directories in the second list to the linker "
     << "search path in case they are needed to find libraries from the "
     << "first list (for backwards compatibility with CMake 2.4).  "
     << "Set policy CMP0003 to OLD or NEW to enable or disable this "
     << "behavior explicitly.  "
     << "Run \"cmake --help-policy CMP0003\" for more information.";
}